

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

Range<wchar_t> __thiscall
Centaurus::CharClass<wchar_t>::operator[](CharClass<wchar_t> *this,int index)

{
  size_type sVar1;
  const_reference r;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  Range<wchar_t> RVar3;
  int index_local;
  CharClass<wchar_t> *this_local;
  
  if (-1 < in_EDX) {
    sVar1 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
            size((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *)
                 (CONCAT44(in_register_00000034,index) + 8));
    if ((ulong)(long)in_EDX < sVar1) {
      r = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
          operator[]((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                      *)(CONCAT44(in_register_00000034,index) + 8),(long)in_EDX);
      Range<wchar_t>::Range((Range<wchar_t> *)this,r);
      uVar2 = extraout_RDX;
      goto LAB_00157195;
    }
  }
  Range<wchar_t>::Range((Range<wchar_t> *)this);
  uVar2 = extraout_RDX_00;
LAB_00157195:
  RVar3.m_start = (int)uVar2;
  RVar3.m_end = (int)((ulong)uVar2 >> 0x20);
  RVar3._vptr_Range = (_func_int **)this;
  return RVar3;
}

Assistant:

Range<TCHAR> operator[](int index) const
    {
        if (index >= 0 && index < m_ranges.size())
            return m_ranges[index];
        return Range<TCHAR>();
    }